

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O2

Client __thiscall capnp::EzRpcServer::Impl::restore(Impl *this,Reader objectId)

{
  bool bVar1;
  iterator iVar2;
  ClientHook *extraout_RDX;
  ClientHook *pCVar3;
  ClientHook *extraout_RDX_00;
  long in_RSI;
  _Base_ptr p_Var4;
  Client CVar5;
  Fault f;
  ReaderFor<capnp::Text> name;
  
  bVar1 = AnyPointer::Reader::isNull(&objectId);
  if (bVar1) {
    p_Var4 = *(_Base_ptr *)(in_RSI + 0x18);
  }
  else {
    name = AnyPointer::Reader::getAs<capnp::Text>(&objectId);
    iVar2 = std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
            ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
                    *)(in_RSI + 0x30),&name.super_StringPtr);
    if (iVar2._M_node == (_Base_ptr)(in_RSI + 0x38)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35],capnp::Text::Reader&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++"
                 ,0x139,FAILED,(char *)0x0,"\"Server exports no such capability.\", name",
                 (char (*) [35])"Server exports no such capability.",(Reader *)&name.super_StringPtr
                );
      kj::_::Debug::Fault::~Fault(&f);
      Capability::Client::Client((Client *)this,(void *)0x0);
      pCVar3 = extraout_RDX_00;
      goto LAB_00410468;
    }
    p_Var4 = iVar2._M_node[2]._M_left;
  }
  (**(code **)(*(long *)p_Var4 + 0x20))(this);
  pCVar3 = extraout_RDX;
LAB_00410468:
  CVar5.hook.ptr = pCVar3;
  CVar5.hook.disposer = (Disposer *)this;
  return (Client)CVar5.hook;
}

Assistant:

Capability::Client restore(AnyPointer::Reader objectId) override {
    if (objectId.isNull()) {
      return mainInterface;
    } else {
      auto name = objectId.getAs<Text>();
      auto iter = exportMap.find(name);
      if (iter == exportMap.end()) {
        KJ_FAIL_REQUIRE("Server exports no such capability.", name) { break; }
        return nullptr;
      } else {
        return iter->second.cap;
      }
    }
  }